

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small.c
# Opt level: O3

void small_alloc_create(small_alloc *alloc,slab_cache *cache,uint32_t objsize_min,uint granularity,
                       float alloc_factor,float *actual_alloc_factor)

{
  small_mempool *psVar1;
  uint8_t uVar2;
  undefined1 uVar3;
  slab_cache *cache_00;
  int iVar4;
  uint8_t uVar5;
  uint8_t uVar6;
  byte bVar7;
  uint uVar8;
  uint uVar9;
  long lVar10;
  bool bVar11;
  ulong uVar12;
  ulong uVar13;
  uint uVar14;
  ulong uVar15;
  small_mempool *pool;
  uint uVar16;
  small_mempool *local_38;
  
  alloc->cache = cache;
  if ((granularity & granularity - 1) != 0) {
    __assert_fail("(alignment & (alignment - 1)) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/include/small/util.h"
                  ,0x7f,"size_t small_align(size_t, size_t)");
  }
  uVar3 = cache->order0_size_lb;
  alloc->objsize_max =
       -granularity &
       (granularity - 1) + ((int)(1L << (cache->order_max + uVar3 & 0x3f)) - 0x70U >> 7) * 8;
  if ((granularity & granularity - 1) == 0) {
    if ((alloc_factor <= 1.0) || (2.0 < alloc_factor)) {
      __assert_fail("alloc_factor > 1. && alloc_factor <= 2.",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/small/small.c"
                    ,0x135,
                    "void small_alloc_create(struct small_alloc *, struct slab_cache *, uint32_t, unsigned int, float, float *)"
                   );
    }
    alloc->factor = alloc_factor;
    small_class_create(&alloc->small_class,granularity,alloc_factor,
                       (objsize_min + granularity) - 1 & -granularity,actual_alloc_factor);
    psVar1 = alloc->small_mempool_cache;
    uVar8 = 0;
    alloc->small_mempool_groups_size = 0;
    alloc->small_mempool_cache_size = 0;
    uVar9 = alloc->objsize_max;
    local_38 = psVar1;
    if (uVar9 == 0) {
      lVar10 = -1;
    }
    else {
      bVar11 = true;
      uVar14 = 0;
      uVar15 = 0;
      uVar5 = '\0';
      do {
        uVar8 = uVar14 + 1;
        uVar16 = (alloc->small_class).effective_mask & uVar8;
        bVar7 = (byte)(alloc->small_class).effective_bits & 0x1f;
        if (uVar8 >> bVar7 == 0) {
          bVar7 = (byte)(0 >> bVar7);
        }
        else {
          bVar7 = (char)(uVar8 >> bVar7) - 1;
          uVar16 = uVar16 | (alloc->small_class).effective_size;
        }
        uVar8 = ((uVar16 << (bVar7 & 0x1f)) << ((byte)(alloc->small_class).ignore_bits_count & 0x1f)
                ) + (alloc->small_class).size_shift;
        if (uVar9 <= uVar8) {
          uVar8 = uVar9;
        }
        uVar9 = 0x70;
        if (0x70 < uVar8) {
          uVar9 = uVar8;
        }
        cache_00 = alloc->cache;
        uVar12 = (ulong)((double)uVar9 / 0.01);
        uVar12 = (long)((double)uVar9 / 0.01 - 9.223372036854776e+18) & (long)uVar12 >> 0x3f |
                 uVar12;
        uVar13 = (ulong)cache_00->arena->slab_size;
        if (uVar13 <= uVar12) {
          uVar12 = uVar13;
        }
        if (cache_00->order0_size < uVar12) {
          uVar9 = (int)uVar12 - 1;
          iVar4 = 0x1f;
          if (uVar9 != 0) {
            for (; uVar9 >> iVar4 == 0; iVar4 = iVar4 + -1) {
            }
          }
          bVar7 = 0x20 - (((byte)iVar4 ^ 0x1f) + cache_00->order0_size_lb);
          if (cache_00->order_max < bVar7) {
            __assert_fail("order <= cache->order_max",
                          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/include/small/mempool.h"
                          ,0xfe,
                          "void mempool_create(struct mempool *, struct slab_cache *, uint32_t)");
          }
        }
        else {
          bVar7 = 0;
        }
        pool = psVar1 + uVar14;
        mempool_create_with_order(&pool->pool,cache_00,uVar8,bVar7);
        (pool->pool).small_mempool = pool;
        pool->objsize_min = uVar15 + 1;
        pool->waste = 0;
        pool->group = (small_mempool_group *)0x0;
        pool->used_pool = (small_mempool *)0x0;
        pool->appropriate_pool_mask = 0;
        uVar2 = (pool->pool).slab_order;
        uVar6 = uVar2;
        if ((!bVar11) && (uVar6 = uVar5, uVar5 != uVar2)) {
          if ((local_38->pool).slab_ptr_mask != pool[-1].pool.slab_ptr_mask) {
            __assert_fail("cur_order_pool->pool.slab_ptr_mask == (pool - 1)->pool.slab_ptr_mask",
                          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/small/small.c"
                          ,0x116,"void small_mempool_create(struct small_alloc *)");
          }
          small_mempool_create_groups(alloc,local_38,pool + -1);
          local_38 = pool;
          uVar6 = uVar2;
        }
        lVar10 = (long)(int)alloc->small_mempool_cache_size;
        uVar14 = alloc->small_mempool_cache_size + 1;
        alloc->small_mempool_cache_size = uVar14;
        uVar9 = alloc->objsize_max;
      } while ((uVar8 < uVar9) &&
              (bVar11 = false, uVar15 = (ulong)uVar8, uVar5 = uVar6, uVar14 < 0x400));
    }
    if ((local_38->pool).slab_ptr_mask != alloc->small_mempool_cache[lVar10].pool.slab_ptr_mask) {
      __assert_fail("cur_order_pool->pool.slab_ptr_mask == last_pool->pool.slab_ptr_mask",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/small/small.c"
                    ,0x121,"void small_mempool_create(struct small_alloc *)");
    }
    small_mempool_create_groups(alloc,local_38,psVar1 + lVar10);
    alloc->objsize_max = uVar8;
    return;
  }
  __assert_fail("(granularity & (granularity - 1)) == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/small/small.c",
                0x134,
                "void small_alloc_create(struct small_alloc *, struct slab_cache *, uint32_t, unsigned int, float, float *)"
               );
}

Assistant:

void
small_alloc_create(struct small_alloc *alloc, struct slab_cache *cache,
		   uint32_t objsize_min, unsigned granularity,
		   float alloc_factor, float *actual_alloc_factor)
{
	alloc->cache = cache;
	/* Align sizes. */
	objsize_min = small_align(objsize_min, granularity);
	/* Make sure at least 4 largest objects can fit in a slab. */
	alloc->objsize_max =
		mempool_objsize_max(slab_order_size(cache, cache->order_max));
	alloc->objsize_max = small_align(alloc->objsize_max, granularity);

	assert((granularity & (granularity - 1)) == 0);
	assert(alloc_factor > 1. && alloc_factor <= 2.);

	alloc->factor = alloc_factor;
	/*
	 * Second parameter granularity, determines alignment.
	 */
	small_class_create(&alloc->small_class, granularity,
			   alloc->factor, objsize_min, actual_alloc_factor);
	small_mempool_create(alloc);
}